

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_map_test.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceMapSerializeTest_MapRoundTripZeroKeyZeroEnum_Test<absl::lts_20250127::Cord>::TestBody
          (NoFieldPresenceMapSerializeTest_MapRoundTripZeroKeyZeroEnum_Test<absl::lts_20250127::Cord>
           *this)

{
  bool bVar1;
  Map<int,_proto2_nofieldpresence_unittest::ForeignEnum> *this_00;
  ForeignEnum *rhs;
  Map<int,_proto2_nofieldpresence_unittest::ForeignEnum> *rhs_container;
  undefined1 *puVar2;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  char *pcVar3;
  char *in_R9;
  pointer *__ptr;
  Cord *output;
  string_view data;
  TestAllMapTypes rt_msg;
  TestAllMapTypes msg;
  AssertHelper local_230;
  AssertHelper local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_220;
  undefined1 local_218 [8];
  UntypedMapBase *local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_208;
  AssertHelper local_1f8;
  UnorderedElementsAreArrayMatcher<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>_>
  local_1f0;
  undefined1 local_1d0 [8];
  InternalMetadata local_1c8;
  undefined1 local_1c0 [64];
  Map<int,_proto2_nofieldpresence_unittest::ForeignEnum> local_180 [4];
  undefined1 local_f8 [80];
  Eq2Matcher local_a8 [136];
  
  proto2_nofieldpresence_unittest::TestAllMapTypes::TestAllMapTypes
            ((TestAllMapTypes *)local_f8,(Arena *)0x0);
  rhs_container = (Map<int,_proto2_nofieldpresence_unittest::ForeignEnum> *)local_218;
  local_218._0_4_ = 0;
  local_228.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_1d0,"static_cast<uint32_t>(FOREIGN_FOO)","0",(uint *)rhs_container,
             (int *)&local_228);
  if (local_1d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if ((UntypedMapBase *)local_1c8.ptr_ == (UntypedMapBase *)0x0) {
      pcVar3 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar3 = *(char **)local_1c8.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_228,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
               ,0x3aa,pcVar3);
    testing::internal::AssertHelper::operator=(&local_228,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper(&local_228);
    if ((long *)CONCAT44(local_218._4_4_,local_218._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_218._4_4_,local_218._0_4_) + 8))();
    }
    if ((UntypedMapBase *)local_1c8.ptr_ == (UntypedMapBase *)0x0) goto LAB_008a1945;
    this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_1c8;
  }
  else {
    if ((UntypedMapBase *)local_1c8.ptr_ != (UntypedMapBase *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_1c8.ptr_);
    }
    this_00 = protobuf::internal::
              TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignEnum>::MutableMap
                        ((TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignEnum>
                          *)(local_f8 + 0x40));
    local_218._0_4_ = 0;
    Map<int,proto2_nofieldpresence_unittest::ForeignEnum>::TryEmplaceInternal<int_const&>
              ((pair<google::protobuf::Map<int,_proto2_nofieldpresence_unittest::ForeignEnum>::iterator,_bool>
                *)local_1d0,this_00,(int *)local_218);
    *(undefined4 *)(CONCAT71(local_1d0._1_7_,local_1d0[0]) + 0xc) = 0;
    output = &(this->super_NoFieldPresenceMapSerializeTest<absl::lts_20250127::Cord>).value_;
    bVar1 = MessageLite::SerializeToString((MessageLite *)local_f8,output);
    local_218[0] = (internal)bVar1;
    local_210 = (UntypedMapBase *)0x0;
    if (bVar1) {
      absl::lts_20250127::Cord::operator_cast_to_string((string *)local_1d0,output);
      local_218[0] = (internal)((UntypedMapBase *)local_1c8.ptr_ != (UntypedMapBase *)0x0);
      local_210 = (UntypedMapBase *)0x0;
      if ((undefined1 *)CONCAT71(local_1d0._1_7_,local_1d0[0]) == local_1c0) {
        if ((UntypedMapBase *)local_1c8.ptr_ != (UntypedMapBase *)0x0) goto LAB_008a1631;
      }
      else {
        operator_delete((undefined1 *)CONCAT71(local_1d0._1_7_,local_1d0[0]),local_1c0._0_8_ + 1);
        if ((local_218._0_4_ & Superset) != 0) {
LAB_008a1631:
          if (local_210 != (UntypedMapBase *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_210,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_210);
          }
          proto2_nofieldpresence_unittest::TestAllMapTypes::TestAllMapTypes
                    ((TestAllMapTypes *)local_1d0,(Arena *)0x0);
          absl::lts_20250127::Cord::operator_cast_to_string((string *)local_218,output);
          data._M_str._4_4_ = local_218._4_4_;
          data._M_str._0_4_ = local_218._0_4_;
          data._M_len = (size_t)local_210;
          bVar1 = MessageLite::ParseFromString((MessageLite *)local_1d0,data);
          local_228.data_._0_4_ = CONCAT31(local_228.data_._1_3_,bVar1);
          local_220 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_218._4_4_,local_218._0_4_) == &aStack_208) {
            if (!bVar1) goto LAB_008a16af;
          }
          else {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_218._4_4_,local_218._0_4_),
                            aStack_208._M_allocated_capacity + 1);
            if (((uint)local_228.data_ & 1) == 0) {
LAB_008a16af:
              testing::Message::Message((Message *)&local_230);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_218,(internal *)&local_228,
                         (AssertionResult *)"rt_msg.ParseFromString(this->GetOutput())","false",
                         "true",in_R9);
              rhs_container = (Map<int,_proto2_nofieldpresence_unittest::ForeignEnum> *)0x3b5;
              testing::internal::AssertHelper::AssertHelper
                        (&local_1f8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
                         ,0x3b5,(char *)CONCAT44(local_218._4_4_,local_218._0_4_));
              testing::internal::AssertHelper::operator=(&local_1f8,(Message *)&local_230);
              testing::internal::AssertHelper::~AssertHelper(&local_1f8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_218._4_4_,local_218._0_4_) != &aStack_208) {
                operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT44(local_218._4_4_,local_218._0_4_),
                                aStack_208._M_allocated_capacity + 1);
              }
              if ((long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) + 8))();
              }
            }
          }
          if (local_220 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_220,local_220);
          }
          protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                    ((MapFieldBase *)(local_f8 + 0x40));
          testing::
          UnorderedPointwise<testing::internal::Eq2Matcher,google::protobuf::Map<int,proto2_nofieldpresence_unittest::ForeignEnum>>
                    (&local_1f0,(testing *)&local_230,local_a8,rhs_container);
          aStack_208._8_8_ =
               local_1f0.matchers_.
               super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          aStack_208._M_allocated_capacity =
               (size_type)
               local_1f0.matchers_.
               super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_210 = (UntypedMapBase *)
                      local_1f0.matchers_.
                      super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          local_1f0.matchers_.
          super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_1f0.matchers_.
          super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1f0.matchers_.
          super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_218._0_4_ = local_1f0.match_flags_;
          protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                    ((MapFieldBase *)(local_1c0 + 0x30));
          testing::internal::
          PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,std::pair<int_const,proto2_nofieldpresence_unittest::ForeignEnum>>>>
          ::operator()(&local_228,local_218,
                       (Map<int,_proto2_nofieldpresence_unittest::ForeignEnum> *)
                       "rt_msg.map_int32_foreign_enum()");
          if (local_210 != (UntypedMapBase *)0x0) {
            operator_delete(local_210,aStack_208._8_8_ - (long)local_210);
          }
          if ((UntypedMapBase *)
              local_1f0.matchers_.
              super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (UntypedMapBase *)0x0) {
            operator_delete(local_1f0.matchers_.
                            super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_1f0.matchers_.
                                  super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_1f0.matchers_.
                                  super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_proto2_nofieldpresence_unittest::ForeignEnum>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_228.data_._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)local_218);
            if (local_220 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar3 = anon_var_dwarf_a22956 + 5;
            }
            else {
              pcVar3 = (local_220->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_230,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
                       ,0x3b7,pcVar3);
            testing::internal::AssertHelper::operator=(&local_230,(Message *)local_218);
            testing::internal::AssertHelper::~AssertHelper(&local_230);
            if ((long *)CONCAT44(local_218._4_4_,local_218._0_4_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(local_218._4_4_,local_218._0_4_) + 8))();
            }
          }
          if (local_220 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_220,local_220);
          }
          local_228.data_._0_4_ = 0;
          protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                    ((MapFieldBase *)(local_1c0 + 0x30));
          local_230.data_._0_4_ = 0;
          rhs = Map<int,_proto2_nofieldpresence_unittest::ForeignEnum>::at<int>
                          (local_180,(key_arg<int> *)&local_230);
          testing::internal::
          CmpHelperEQ<proto2_nofieldpresence_unittest::ForeignEnum,proto2_nofieldpresence_unittest::ForeignEnum>
                    ((internal *)local_218,"FOREIGN_FOO","rt_msg.map_int32_foreign_enum().at(0)",
                     (ForeignEnum *)&local_228,rhs);
          if (local_218[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_228);
            if (local_210 == (UntypedMapBase *)0x0) {
              pcVar3 = anon_var_dwarf_a22956 + 5;
            }
            else {
              pcVar3 = *(char **)local_210;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_230,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
                       ,0x3bb,pcVar3);
            testing::internal::AssertHelper::operator=(&local_230,(Message *)&local_228);
            testing::internal::AssertHelper::~AssertHelper(&local_230);
            if ((long *)CONCAT44(local_228.data_._4_4_,(uint)local_228.data_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(local_228.data_._4_4_,(uint)local_228.data_) + 8))();
            }
          }
          if (local_210 != (UntypedMapBase *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_210,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_210);
          }
          proto2_nofieldpresence_unittest::TestAllMapTypes::~TestAllMapTypes
                    ((TestAllMapTypes *)local_1d0);
          goto LAB_008a1945;
        }
      }
      testing::Message::Message((Message *)&local_228);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1d0,(internal *)local_218,
                 (AssertionResult *)"this->GetOutput().empty()","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_230,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
                 ,0x3b1,(char *)CONCAT71(local_1d0._1_7_,local_1d0[0]));
      testing::internal::AssertHelper::operator=(&local_230,(Message *)&local_228);
      testing::internal::AssertHelper::~AssertHelper(&local_230);
      puVar2 = (undefined1 *)CONCAT71(local_1d0._1_7_,local_1d0[0]);
      if (puVar2 != local_1c0) {
LAB_008a1590:
        operator_delete(puVar2,local_1c0._0_8_ + 1);
      }
    }
    else {
      testing::Message::Message((Message *)&local_228);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1d0,(internal *)local_218,
                 (AssertionResult *)"TestSerialize(msg, &output_sink)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_230,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
                 ,0x3af,(char *)CONCAT71(local_1d0._1_7_,local_1d0[0]));
      testing::internal::AssertHelper::operator=(&local_230,(Message *)&local_228);
      testing::internal::AssertHelper::~AssertHelper(&local_230);
      puVar2 = (undefined1 *)CONCAT71(local_1d0._1_7_,local_1d0[0]);
      if (puVar2 != local_1c0) goto LAB_008a1590;
    }
    this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_210;
    if ((long *)CONCAT44(local_228.data_._4_4_,(uint)local_228.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_228.data_._4_4_,(uint)local_228.data_) + 8))();
    }
    local_1c8.ptr_ = (intptr_t)local_210;
    if (local_210 == (UntypedMapBase *)0x0) goto LAB_008a1945;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_1c8.ptr_);
LAB_008a1945:
  proto2_nofieldpresence_unittest::TestAllMapTypes::~TestAllMapTypes((TestAllMapTypes *)local_f8);
  return;
}

Assistant:

TYPED_TEST(NoFieldPresenceMapSerializeTest, MapRoundTripZeroKeyZeroEnum) {
  TestAllMapTypes msg;
  ASSERT_EQ(static_cast<uint32_t>(FOREIGN_FOO), 0);
  (*msg.mutable_map_int32_foreign_enum())[0] = FOREIGN_FOO;

  // Test that message can serialize.
  TypeParam& output_sink = this->GetOutputSinkRef();
  ASSERT_TRUE(TestSerialize(msg, &output_sink));
  // Maps with zero key or value fields are still serialized.
  ASSERT_FALSE(this->GetOutput().empty());

  // Test that message can roundtrip.
  TestAllMapTypes rt_msg;
  EXPECT_TRUE(rt_msg.ParseFromString(this->GetOutput()));
  EXPECT_THAT(rt_msg.map_int32_foreign_enum(),
              UnorderedPointwise(Eq(), msg.map_int32_foreign_enum()));

  // The map behaviour is pretty much the same whether the key/value field is
  // zero or not.
  EXPECT_EQ(FOREIGN_FOO, rt_msg.map_int32_foreign_enum().at(0));
}